

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

bool __thiscall
jpge::jpeg_encoder::jpg_open(jpeg_encoder *this,int p_x_res,int p_y_res,int src_channels)

{
  uint8 (*pauVar1) [17];
  uint8 (*pauVar2) [256];
  undefined1 uVar3;
  uint uVar4;
  int iVar5;
  uint8 *puVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  undefined1 *puVar10;
  long lVar11;
  uint uVar12;
  
  this->m_num_components = '\x03';
  switch((this->m_params).m_subsampling) {
  case Y_ONLY:
    this->m_num_components = '\x01';
    this->m_comp_h_samp[0] = '\x01';
    this->m_comp_v_samp[0] = '\x01';
    this->m_mcu_x = 8;
    this->m_mcu_y = 8;
    iVar8 = 1;
    break;
  case H1V1:
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_comp_h_samp[0] = '\x01';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[0] = '\x01';
    this->m_mcu_x = 8;
    this->m_mcu_y = 8;
    iVar8 = 3;
    break;
  case H2V1:
    this->m_comp_h_samp[0] = '\x02';
    *(undefined4 *)(this->m_comp_h_samp + 1) = 0x1010101;
    this->m_comp_v_samp[2] = '\x01';
    this->m_mcu_x = 0x10;
    this->m_mcu_y = 8;
    iVar5 = 0x10;
    uVar12 = 8;
    goto LAB_0011434b;
  case H2V2:
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_comp_h_samp[0] = '\x02';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[0] = '\x02';
    this->m_mcu_x = 0x10;
    this->m_mcu_y = 0x10;
    uVar12 = 0x10;
    iVar8 = 3;
    iVar5 = 0x10;
    goto LAB_00114350;
  default:
    iVar5 = this->m_mcu_x;
    uVar12 = this->m_mcu_y;
LAB_0011434b:
    iVar8 = 3;
    goto LAB_00114350;
  }
  uVar12 = 8;
  iVar5 = 8;
LAB_00114350:
  this->m_image_x = p_x_res;
  this->m_image_y = p_y_res;
  this->m_image_bpp = src_channels;
  this->m_image_bpl = src_channels * p_x_res;
  uVar4 = -iVar5 & (p_x_res + iVar5) - 1U;
  this->m_image_x_mcu = uVar4;
  this->m_image_y_mcu = -uVar12 & (p_y_res + uVar12) - 1;
  this->m_image_bpl_xlt = p_x_res * iVar8;
  iVar8 = iVar8 * uVar4;
  this->m_image_bpl_mcu = iVar8;
  this->m_mcus_per_row = (int)uVar4 / iVar5;
  puVar6 = (uint8 *)malloc((long)(int)(iVar8 * uVar12));
  this->m_mcu_lines[0] = puVar6;
  if (puVar6 == (uint8 *)0x0) {
    uVar3 = 0;
  }
  else {
    if (1 < (int)uVar12) {
      lVar9 = 0;
      do {
        puVar6 = puVar6 + iVar8;
        this->m_mcu_lines[lVar9 + 1] = puVar6;
        lVar9 = lVar9 + 1;
      } while ((ulong)uVar12 - 1 != lVar9);
    }
    iVar5 = (this->m_params).m_quality;
    if (iVar5 < 0x32) {
      iVar5 = (int)(5000 / (long)iVar5);
    }
    else {
      iVar5 = iVar5 * -2 + 200;
    }
    lVar9 = 0;
    do {
      lVar11 = (long)*(short *)((long)&s_std_lum_quant + lVar9) * (long)iVar5;
      uVar7 = SUB168(SEXT816(lVar11 + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) + lVar11 + 0x32;
      iVar8 = (int)(uVar7 >> 6) - (int)((long)uVar7 >> 0x3f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      *(int *)((long)this->m_quantization_tables[0] + lVar9 * 2) = iVar8;
      lVar9 = lVar9 + 2;
    } while ((int)lVar9 != 0x80);
    puVar10 = s_std_croma_quant;
    if ((this->m_params).m_no_chroma_discrim_flag != false) {
      puVar10 = (undefined1 *)&s_std_lum_quant;
    }
    iVar5 = (this->m_params).m_quality;
    if (iVar5 < 0x32) {
      iVar5 = (int)(5000 / (long)iVar5);
    }
    else {
      iVar5 = iVar5 * -2 + 200;
    }
    lVar9 = 0;
    do {
      uVar7 = SUB168(SEXT816((long)*(short *)((long)puVar10 + lVar9 * 2) * (long)iVar5 + 0x32) *
                     SEXT816(-0x5c28f5c28f5c28f5),8) +
              (long)*(short *)((long)puVar10 + lVar9 * 2) * (long)iVar5 + 0x32;
      iVar8 = (int)(uVar7 >> 6) - (int)((long)uVar7 >> 0x3f);
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      if (0xfe < iVar8) {
        iVar8 = 0xff;
      }
      this->m_quantization_tables[1][lVar9] = iVar8;
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 != 0x40);
    this->m_out_buf_left = 0x800;
    this->m_pOut_buf = this->m_out_buf;
    if ((this->m_params).m_two_pass_flag == false) {
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 2) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 3) = '\x05';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 4) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 5) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 6) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 7) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 8) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 9) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 10) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xb) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xc) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xd) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xe) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xf) = '\0';
      this->m_huff_bits[0][0x10] = '\0';
      *(uint8 *)((long)(this->m_huff_val + 0) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 0) + 1) = '\x01';
      *(uint8 *)((long)(this->m_huff_val + 0) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_val + 0) + 3) = '\x03';
      *(uint8 *)((long)(this->m_huff_val + 0) + 4) = '\x04';
      *(uint8 *)((long)(this->m_huff_val + 0) + 5) = '\x05';
      *(uint8 *)((long)(this->m_huff_val + 0) + 6) = '\x06';
      *(uint8 *)((long)(this->m_huff_val + 0) + 7) = '\a';
      *(uint8 *)((long)(this->m_huff_val + 0) + 8) = '\b';
      *(uint8 *)((long)(this->m_huff_val + 0) + 9) = '\t';
      *(uint8 *)((long)(this->m_huff_val + 0) + 10) = '\n';
      *(uint8 *)((long)(this->m_huff_val + 0) + 0xb) = '\v';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 4) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 5) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 6) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 7) = '\x04';
      pauVar1 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar1 + 2) + 8) = '\x03';
      *(uint8 *)((long)(pauVar1 + 2) + 9) = '\x05';
      *(uint8 *)((long)(pauVar1 + 2) + 10) = '\x05';
      *(uint8 *)((long)(pauVar1 + 2) + 0xb) = '\x04';
      *(uint8 *)((long)(pauVar1 + 2) + 0xc) = '\x04';
      *(uint8 *)((long)(pauVar1 + 2) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar1 + 2) + 0xe) = '\0';
      *(uint8 *)((long)(pauVar1 + 2) + 0xf) = '\x01';
      this->m_huff_bits[2][0x10] = '}';
      memcpy(this->m_huff_val + 2,s_ac_lum_val,0x100);
      this->m_huff_bits[1][0x10] = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 2) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 4) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 5) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 6) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 7) = '\x01';
      pauVar1 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar1 + 1) + 8) = '\x01';
      *(uint8 *)((long)(pauVar1 + 1) + 9) = '\x01';
      *(uint8 *)((long)(pauVar1 + 1) + 10) = '\x01';
      *(uint8 *)((long)(pauVar1 + 1) + 0xb) = '\x01';
      *(uint8 *)((long)(pauVar1 + 1) + 0xc) = '\0';
      *(uint8 *)((long)(pauVar1 + 1) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar1 + 1) + 0xe) = '\0';
      *(uint8 *)((long)(pauVar1 + 1) + 0xf) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 1) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 1) + 1) = '\x01';
      *(uint8 *)((long)(this->m_huff_val + 1) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_val + 1) + 3) = '\x03';
      *(uint8 *)((long)(this->m_huff_val + 1) + 4) = '\x04';
      *(uint8 *)((long)(this->m_huff_val + 1) + 5) = '\x05';
      *(uint8 *)((long)(this->m_huff_val + 1) + 6) = '\x06';
      *(uint8 *)((long)(this->m_huff_val + 1) + 7) = '\a';
      pauVar2 = this->m_huff_val;
      *(uint8 *)((long)(pauVar2 + 1) + 8) = '\b';
      *(uint8 *)((long)(pauVar2 + 1) + 9) = '\t';
      *(uint8 *)((long)(pauVar2 + 1) + 10) = '\n';
      *(uint8 *)((long)(pauVar2 + 1) + 0xb) = '\v';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 4) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 5) = '\x04';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 6) = '\x04';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 7) = '\x03';
      pauVar1 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar1 + 3) + 8) = '\x04';
      *(uint8 *)((long)(pauVar1 + 3) + 9) = '\a';
      *(uint8 *)((long)(pauVar1 + 3) + 10) = '\x05';
      *(uint8 *)((long)(pauVar1 + 3) + 0xb) = '\x04';
      *(uint8 *)((long)(pauVar1 + 3) + 0xc) = '\x04';
      *(uint8 *)((long)(pauVar1 + 3) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar1 + 3) + 0xe) = '\x01';
      *(uint8 *)((long)(pauVar1 + 3) + 0xf) = '\x02';
      this->m_huff_bits[3][0x10] = 'w';
      memcpy(this->m_huff_val + 3,s_ac_chroma_val,0x100);
      second_pass_init(this);
    }
    else {
      this->m_bit_buffer = 0;
      this->m_bits_in = 0;
      this->m_mcu_y_ofs = '\0';
      memset(this->m_huff_count,0,0x100c);
      this->m_pass_num = '\x01';
    }
    uVar3 = this->m_all_stream_writes_succeeded;
  }
  return (bool)uVar3;
}

Assistant:

bool jpeg_encoder::jpg_open(int p_x_res, int p_y_res, int src_channels)
{
  m_num_components = 3;
  switch (m_params.m_subsampling)
  {
    case Y_ONLY:
    {
      m_num_components = 1;
      m_comp_h_samp[0] = 1; m_comp_v_samp[0] = 1;
      m_mcu_x          = 8; m_mcu_y          = 8;
      break;
    }
    case H1V1:
    {
      m_comp_h_samp[0] = 1; m_comp_v_samp[0] = 1;
      m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
      m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
      m_mcu_x          = 8; m_mcu_y          = 8;
      break;
    }
    case H2V1:
    {
      m_comp_h_samp[0] = 2; m_comp_v_samp[0] = 1;
      m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
      m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
      m_mcu_x          = 16; m_mcu_y         = 8;
      break;
    }
    case H2V2:
    {
      m_comp_h_samp[0] = 2; m_comp_v_samp[0] = 2;
      m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
      m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
      m_mcu_x          = 16; m_mcu_y         = 16;
    }
  }

  m_image_x        = p_x_res; m_image_y = p_y_res;
  m_image_bpp      = src_channels;
  m_image_bpl      = m_image_x * src_channels;
  m_image_x_mcu    = (m_image_x + m_mcu_x - 1) & (~(m_mcu_x - 1));
  m_image_y_mcu    = (m_image_y + m_mcu_y - 1) & (~(m_mcu_y - 1));
  m_image_bpl_xlt  = m_image_x * m_num_components;
  m_image_bpl_mcu  = m_image_x_mcu * m_num_components;
  m_mcus_per_row   = m_image_x_mcu / m_mcu_x;

  if ((m_mcu_lines[0] = static_cast<uint8*>(jpge_malloc(m_image_bpl_mcu * m_mcu_y))) == NULL) return false;
  for (int i = 1; i < m_mcu_y; i++)
    m_mcu_lines[i] = m_mcu_lines[i-1] + m_image_bpl_mcu;

  compute_quant_table(m_quantization_tables[0], s_std_lum_quant);
  compute_quant_table(m_quantization_tables[1], m_params.m_no_chroma_discrim_flag ? s_std_lum_quant : s_std_croma_quant);

  m_out_buf_left = JPGE_OUT_BUF_SIZE;
  m_pOut_buf = m_out_buf;

  if (m_params.m_two_pass_flag)
  {
    clear_obj(m_huff_count);
    first_pass_init();
  }
  else
  {
    memcpy(m_huff_bits[0+0], s_dc_lum_bits, 17);    memcpy(m_huff_val [0+0], s_dc_lum_val, DC_LUM_CODES);
    memcpy(m_huff_bits[2+0], s_ac_lum_bits, 17);    memcpy(m_huff_val [2+0], s_ac_lum_val, AC_LUM_CODES);
    memcpy(m_huff_bits[0+1], s_dc_chroma_bits, 17); memcpy(m_huff_val [0+1], s_dc_chroma_val, DC_CHROMA_CODES);
    memcpy(m_huff_bits[2+1], s_ac_chroma_bits, 17); memcpy(m_huff_val [2+1], s_ac_chroma_val, AC_CHROMA_CODES);
    if (!second_pass_init()) return false;   // in effect, skip over the first pass
  }
  return m_all_stream_writes_succeeded;
}